

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuFailInternal(CuTest *tc,char *file,int line,CuString *string)

{
  char local_2028 [8];
  char buf [8192];
  CuString *string_local;
  int line_local;
  char *file_local;
  CuTest *tc_local;
  
  buf._8184_8_ = string;
  sprintf(local_2028,"%s:%d: ",file,(ulong)(uint)line);
  CuStringInsert((CuString *)buf._8184_8_,local_2028,0);
  tc->failed = 1;
  tc->message = *(char **)(buf._8184_8_ + 8);
  if (tc->jumpBuf != (jmp_buf *)0x0) {
    longjmp((__jmp_buf_tag *)tc->jumpBuf,0);
  }
  return;
}

Assistant:

static void CuFailInternal(CuTest* tc, const char* file, int line, CuString* string)
{
	char buf[HUGE_STRING_LEN];

	sprintf(buf, "%s:%d: ", file, line);
	CuStringInsert(string, buf, 0);

	tc->failed = 1;
	tc->message = string->buffer;
	if (tc->jumpBuf != 0) longjmp(*(tc->jumpBuf), 0);
}